

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  byte bVar4;
  short sVar5;
  byte bVar6;
  stbi_uc sVar7;
  int iVar8;
  stbi__uint32 sVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  stbi__jpeg *z;
  stbi__context *psVar13;
  ulong uVar14;
  void *pvVar15;
  code *pcVar16;
  undefined8 *puVar17;
  int iVar18;
  char *pcVar19;
  byte *pbVar20;
  long lVar21;
  undefined8 *puVar22;
  int extraout_EDX;
  uint uVar23;
  int why;
  int why_00;
  ulong extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar24;
  ulong extraout_RDX_01;
  undefined8 extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  stbi_uc *psVar25;
  stbi_uc *extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  uint uVar26;
  int iVar27;
  int iVar28;
  undefined1 *puVar29;
  byte *pbVar30;
  short *psVar31;
  uint uVar32;
  anon_struct_96_18_0d0905d3 *paVar33;
  stbi_uc *psVar34;
  ulong uVar35;
  int iVar36;
  stbi__context *s_00;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  uint uVar40;
  stbi_uc **ppsVar41;
  long *in_FS_OFFSET;
  bool bVar42;
  undefined1 auVar43 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_174;
  stbi_uc *local_158 [3];
  long lStack_140;
  ulong local_138;
  uint local_130;
  int local_12c;
  anon_struct_96_18_0d0905d3 *local_128;
  int local_11c;
  long local_118;
  stbi__uint32 *local_110;
  stbi__uint32 *local_108;
  int *local_100;
  short local_f8 [4];
  long local_f0 [2];
  int local_e0 [44];
  
  z = (stbi__jpeg *)calloc(1,0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
    return (void *)0x0;
  }
  z->s = s;
  z->idct_block_kernel = stbi__idct_simd;
  z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  s->img_n = 0;
  if ((uint)req_comp < 5) {
    local_138 = CONCAT44(local_138._4_4_,req_comp);
    z->img_comp[0].raw_data = (void *)0x0;
    z->img_comp[0].raw_coeff = (void *)0x0;
    z->img_comp[1].raw_data = (void *)0x0;
    z->img_comp[1].raw_coeff = (void *)0x0;
    z->img_comp[2].raw_data = (void *)0x0;
    z->img_comp[2].raw_coeff = (void *)0x0;
    z->img_comp[3].raw_data = (void *)0x0;
    z->img_comp[3].raw_coeff = (void *)0x0;
    z->restart_interval = 0;
    local_110 = (stbi__uint32 *)x;
    local_108 = (stbi__uint32 *)y;
    local_100 = comp;
    iVar8 = stbi__decode_jpeg_header(z,0);
    uVar35 = extraout_RDX;
    if (iVar8 == 0) {
LAB_001246c9:
      iVar8 = (int)uVar35;
      uVar12 = z->s->img_n;
    }
    else {
      paVar1 = z->img_comp;
      bVar6 = stbi__get_marker(z);
      uVar24 = extraout_RDX_00;
LAB_00122961:
      iVar8 = (int)uVar24;
      if (bVar6 == 0xda) {
        iVar8 = stbi__get16be(z->s);
        psVar13 = z->s;
        pbVar30 = psVar13->img_buffer;
        uVar35 = extraout_RDX_03;
        if (psVar13->img_buffer_end <= pbVar30) {
          if (psVar13->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar13);
            pbVar30 = psVar13->img_buffer;
            uVar35 = extraout_RDX_04;
            goto LAB_00122a02;
          }
          z->scan_n = 0;
LAB_001246af:
          pcVar19 = "bad SOS component count";
          goto LAB_001246b6;
        }
LAB_00122a02:
        psVar13->img_buffer = pbVar30 + 1;
        bVar6 = *pbVar30;
        z->scan_n = (uint)bVar6;
        if (((byte)(bVar6 - 5) < 0xfc) || (psVar13 = z->s, psVar13->img_n < (int)(uint)bVar6))
        goto LAB_001246af;
        if (iVar8 != (uint)bVar6 * 2 + 6) {
          pcVar19 = "bad SOS len";
          goto LAB_001246b6;
        }
        lVar39 = 0;
        s_00 = psVar13;
        do {
          pbVar20 = s_00->img_buffer;
          pbVar30 = s_00->img_buffer_end;
          if (pbVar20 < pbVar30) {
LAB_00122a77:
            s_00->img_buffer = pbVar20 + 1;
            uVar12 = (uint)*pbVar20;
            pbVar20 = psVar13->img_buffer;
            pbVar30 = psVar13->img_buffer_end;
            s_00 = psVar13;
          }
          else {
            if (s_00->read_from_callbacks != 0) {
              stbi__refill_buffer(s_00);
              pbVar20 = s_00->img_buffer;
              psVar13 = z->s;
              goto LAB_00122a77;
            }
            uVar12 = 0;
          }
          if (pbVar20 < pbVar30) {
LAB_00122ab9:
            s_00->img_buffer = pbVar20 + 1;
            bVar6 = *pbVar20;
            s_00 = psVar13;
          }
          else {
            if (s_00->read_from_callbacks != 0) {
              stbi__refill_buffer(s_00);
              pbVar20 = s_00->img_buffer;
              psVar13 = z->s;
              goto LAB_00122ab9;
            }
            bVar6 = 0;
          }
          iVar8 = s_00->img_n;
          if ((long)iVar8 < 1) {
            uVar35 = 0;
          }
          else {
            uVar35 = 0;
            paVar33 = paVar1;
            while (paVar33->id != uVar12) {
              uVar35 = uVar35 + 1;
              paVar33 = paVar33 + 1;
              if ((long)iVar8 == uVar35) goto LAB_001246c9;
            }
          }
          if ((int)uVar35 == iVar8) goto LAB_001246c9;
          z->img_comp[uVar35 & 0xffffffff].hd = (uint)(bVar6 >> 4);
          if (0x3f < bVar6) {
            pcVar19 = "bad DC huff";
            goto LAB_001246b6;
          }
          paVar1[uVar35 & 0xffffffff].ha = bVar6 & 0xf;
          if (3 < (bVar6 & 0xf)) {
            pcVar19 = "bad AC huff";
            goto LAB_001246b6;
          }
          z->order[lVar39] = (int)uVar35;
          lVar39 = lVar39 + 1;
        } while (lVar39 < z->scan_n);
        pbVar20 = s_00->img_buffer;
        pbVar30 = s_00->img_buffer_end;
        if (pbVar20 < pbVar30) {
LAB_00122b89:
          s_00->img_buffer = pbVar20 + 1;
          uVar12 = (uint)*pbVar20;
          pbVar20 = psVar13->img_buffer;
          pbVar30 = psVar13->img_buffer_end;
          s_00 = psVar13;
        }
        else {
          if (s_00->read_from_callbacks != 0) {
            stbi__refill_buffer(s_00);
            pbVar20 = s_00->img_buffer;
            psVar13 = z->s;
            goto LAB_00122b89;
          }
          uVar12 = 0;
        }
        z->spec_start = uVar12;
        if (pbVar20 < pbVar30) {
LAB_00122bd3:
          s_00->img_buffer = pbVar20 + 1;
          uVar12 = (uint)*pbVar20;
          pbVar20 = psVar13->img_buffer;
          pbVar30 = psVar13->img_buffer_end;
          s_00 = psVar13;
        }
        else {
          if (s_00->read_from_callbacks != 0) {
            stbi__refill_buffer(s_00);
            pbVar20 = s_00->img_buffer;
            psVar13 = z->s;
            goto LAB_00122bd3;
          }
          uVar12 = 0;
        }
        z->spec_end = uVar12;
        if (pbVar20 < pbVar30) {
LAB_00122c19:
          s_00->img_buffer = pbVar20 + 1;
          uVar12 = (uint)*pbVar20;
        }
        else {
          if (s_00->read_from_callbacks != 0) {
            stbi__refill_buffer(s_00);
            pbVar20 = s_00->img_buffer;
            goto LAB_00122c19;
          }
          uVar12 = 0;
        }
        z->succ_high = uVar12 >> 4;
        uVar23 = uVar12 & 0xf;
        uVar35 = (ulong)uVar23;
        z->succ_low = uVar23;
        iVar8 = z->progressive;
        iVar11 = z->spec_start;
        if (iVar8 == 0) {
          if (iVar11 != 0 || uVar12 != 0) {
LAB_00124732:
            pcVar19 = "bad SOS";
            goto LAB_001246b6;
          }
          z->spec_end = 0x3f;
        }
        else if ((((0x3f < iVar11) || (0x3f < z->spec_end)) || (z->spec_end < iVar11)) ||
                ((0xdf < uVar12 || (0xd < uVar23)))) goto LAB_00124732;
        uVar12 = z->scan_n;
        uVar35 = (ulong)uVar12;
        iVar11 = z->restart_interval;
        if (iVar11 == 0) {
          iVar11 = 0x7fffffff;
        }
        z->code_buffer = 0;
        z->code_bits = 0;
        z->nomore = 0;
        z->img_comp[3].dc_pred = 0;
        z->img_comp[2].dc_pred = 0;
        z->img_comp[1].dc_pred = 0;
        z->img_comp[0].dc_pred = 0;
        z->marker = 0xff;
        z->todo = iVar11;
        z->eob_run = 0;
        if (iVar8 == 0) {
          if (uVar12 == 1) {
            iVar8 = z->order[0];
            iVar11 = z->img_comp[iVar8].y + 7 >> 3;
            bVar42 = true;
            if (0 < iVar11) {
              uVar12 = paVar1[iVar8].x + 7 >> 3;
              iVar18 = 0;
              iVar36 = 0;
              do {
                if (0 < (int)uVar12) {
                  lVar39 = 0;
                  do {
                    iVar27 = stbi__jpeg_decode_block
                                       (z,local_f8,z->huff_dc + paVar1[iVar8].hd,
                                        z->huff_ac + paVar1[iVar8].ha,z->fast_ac[paVar1[iVar8].ha],
                                        iVar8,z->dequant[paVar1[iVar8].tq]);
                    uVar37 = extraout_RDX_06;
                    if (iVar27 == 0) goto LAB_00123b7d;
                    (*z->idct_block_kernel)
                              (paVar1[iVar8].data + lVar39 + iVar18 * paVar1[iVar8].w2,
                               paVar1[iVar8].w2,local_f8);
                    iVar27 = z->todo;
                    z->todo = iVar27 + -1;
                    uVar35 = extraout_RDX_07;
                    if (iVar27 < 2) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                        uVar35 = extraout_RDX_08;
                      }
                      if ((z->marker & 0xf8) != 0xd0) goto LAB_00123b76;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar27 = z->restart_interval;
                      uVar35 = 0x7fffffff;
                      if (iVar27 == 0) {
                        iVar27 = 0x7fffffff;
                      }
                      z->todo = iVar27;
                      z->eob_run = 0;
                    }
                    lVar39 = lVar39 + 8;
                  } while ((ulong)uVar12 * 8 != lVar39);
                }
                iVar36 = iVar36 + 1;
                iVar18 = iVar18 + 8;
              } while (iVar36 != iVar11);
LAB_00123b76:
              bVar42 = true;
            }
          }
          else {
            uVar35 = (ulong)(uint)z->img_mcu_y;
            bVar42 = true;
            if (0 < z->img_mcu_y) {
              iVar8 = z->img_mcu_x;
              iVar36 = 0;
              do {
                if (0 < iVar8) {
                  uVar12 = 0;
                  do {
                    iVar8 = z->scan_n;
                    if (0 < iVar8) {
                      uVar35 = 0;
                      do {
                        iVar11 = z->order[uVar35];
                        iVar18 = z->img_comp[iVar11].v;
                        if (0 < iVar18) {
                          iVar8 = paVar1[iVar11].h;
                          iVar27 = 0;
                          do {
                            if (0 < iVar8) {
                              iVar18 = 0;
                              do {
                                iVar28 = paVar1[iVar11].v;
                                iVar10 = stbi__jpeg_decode_block
                                                   (z,local_f8,z->huff_dc + paVar1[iVar11].hd,
                                                    z->huff_ac + paVar1[iVar11].ha,
                                                    z->fast_ac[paVar1[iVar11].ha],iVar11,
                                                    z->dequant[paVar1[iVar11].tq]);
                                uVar37 = extraout_RDX_10;
                                if (iVar10 == 0) goto LAB_00123b7d;
                                (*z->idct_block_kernel)
                                          (paVar1[iVar11].data +
                                           (long)(int)((iVar8 * uVar12 + iVar18) * 8) +
                                           (long)((iVar28 * iVar36 + iVar27) * paVar1[iVar11].w2 * 8
                                                 ),paVar1[iVar11].w2,local_f8);
                                iVar18 = iVar18 + 1;
                                iVar8 = paVar1[iVar11].h;
                              } while (iVar18 < iVar8);
                              iVar18 = paVar1[iVar11].v;
                            }
                            iVar27 = iVar27 + 1;
                          } while (iVar27 < iVar18);
                          iVar8 = z->scan_n;
                        }
                        uVar35 = uVar35 + 1;
                      } while ((long)uVar35 < (long)iVar8);
                      iVar11 = z->todo;
                    }
                    z->todo = iVar11 + -1;
                    bVar42 = iVar11 < 2;
                    iVar11 = iVar11 + -1;
                    if (bVar42) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                        uVar35 = extraout_RDX_11;
                      }
                      if ((z->marker & 0xf8) != 0xd0) goto LAB_00123b76;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar11 = z->restart_interval;
                      if (iVar11 == 0) {
                        iVar11 = 0x7fffffff;
                      }
                      z->todo = iVar11;
                      z->eob_run = 0;
                    }
                    uVar12 = uVar12 + 1;
                    uVar35 = (ulong)uVar12;
                    iVar8 = z->img_mcu_x;
                  } while ((int)uVar12 < iVar8);
                  uVar35 = (ulong)(uint)z->img_mcu_y;
                }
                iVar36 = iVar36 + 1;
              } while (iVar36 < (int)uVar35);
              goto LAB_00123b76;
            }
          }
          goto LAB_00123b7f;
        }
        if (uVar12 == 1) {
          local_118 = (long)z->order[0];
          local_11c = z->img_comp[local_118].y + 7 >> 3;
          if (0 < local_11c) {
            paVar33 = paVar1 + local_118;
            local_12c = z->img_comp[local_118].x + 7 >> 3;
            local_174 = 0;
            local_128 = paVar33;
            do {
              if (0 < local_12c) {
                iVar8 = 0;
                do {
                  psVar31 = paVar33->coeff + (paVar33->coeff_w * local_174 + iVar8) * 0x40;
                  uVar37 = (ulong)z->spec_start;
                  if (uVar37 == 0) {
                    iVar11 = stbi__jpeg_decode_block_prog_dc
                                       (z,psVar31,z->huff_dc + paVar33->hd,(int)local_118);
                    uVar35 = extraout_RDX_05;
                    if (iVar11 == 0) goto LAB_001246c9;
                  }
                  else {
                    iVar11 = paVar33->ha;
                    iVar36 = z->eob_run;
                    bVar6 = (byte)z->succ_low;
                    if (z->succ_high == 0) {
                      if (iVar36 == 0) {
                        uVar35 = (ulong)(uint)z->code_bits;
                        do {
                          if ((int)uVar35 < 0x10) {
                            stbi__grow_buffer_unsafe(z);
                          }
                          uVar12 = z->code_buffer;
                          uVar35 = (ulong)(uVar12 >> 0x17);
                          sVar3 = z->fast_ac[iVar11][uVar35];
                          uVar23 = (uint)sVar3;
                          iVar36 = (int)uVar37;
                          if (sVar3 == 0) {
                            if (z->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(z);
                              uVar12 = z->code_buffer;
                              uVar35 = (ulong)(uVar12 >> 0x17);
                            }
                            uVar37 = (ulong)z->huff_ac[iVar11].fast[uVar35];
                            if (uVar37 == 0xff) {
                              lVar39 = 0;
                              do {
                                lVar21 = lVar39;
                                lVar39 = lVar21 + 1;
                              } while (z->huff_ac[iVar11].maxcode[lVar21 + 10] <= uVar12 >> 0x10);
                              uVar23 = z->code_bits;
                              uVar35 = (ulong)uVar23;
                              if (lVar39 == 8) goto LAB_0012473e;
                              if (((int)uVar23 < (int)(lVar21 + 10)) ||
                                 (uVar26 = (uVar12 >> (0x17U - (char)lVar39 & 0x1f) &
                                           stbi__bmask[lVar21 + 10]) +
                                           z->huff_ac[iVar11].delta[lVar21 + 10], 0xff < uVar26))
                              goto LAB_00124749;
                              uVar23 = (uVar23 - (int)lVar39) - 9;
                              uVar35 = (ulong)uVar23;
                              z->code_bits = uVar23;
                              z->code_buffer = uVar12 << ((byte)(lVar21 + 10) & 0x1f);
                              uVar37 = (ulong)uVar26;
                            }
                            else {
                              bVar2 = z->huff_ac[iVar11].size[uVar37];
                              uVar23 = z->code_bits - (uint)bVar2;
                              uVar35 = (ulong)uVar23;
                              if (z->code_bits < (int)(uint)bVar2) goto LAB_00124749;
                              z->code_buffer = uVar12 << (bVar2 & 0x1f);
                              z->code_bits = uVar23;
                            }
                            bVar2 = z->huff_ac[iVar11].values[uVar37];
                            uVar23 = bVar2 & 0xf;
                            bVar4 = bVar2 >> 4;
                            uVar12 = (uint)bVar4;
                            iVar18 = (int)uVar35;
                            if ((bVar2 & 0xf) == 0) {
                              if (bVar2 < 0xf0) {
                                iVar36 = 1 << bVar4;
                                z->eob_run = iVar36;
                                if (0xf < bVar2) {
                                  if (iVar18 < (int)uVar12) {
                                    stbi__grow_buffer_unsafe(z);
                                    iVar18 = z->code_bits;
                                  }
                                  uVar23 = 0;
                                  if ((int)uVar12 <= iVar18) {
                                    uVar23 = z->code_buffer << bVar4 |
                                             z->code_buffer >> 0x20 - bVar4;
                                    uVar26 = stbi__bmask[uVar12];
                                    z->code_buffer = ~uVar26 & uVar23;
                                    uVar23 = uVar23 & uVar26;
                                    z->code_bits = iVar18 - uVar12;
                                  }
                                  iVar36 = uVar23 + z->eob_run;
                                  paVar33 = local_128;
                                }
                                goto LAB_00122edd;
                              }
                              uVar12 = iVar36 + 0x10;
                            }
                            else {
                              lVar39 = (long)iVar36 + (ulong)uVar12;
                              bVar2 = ""[lVar39];
                              if (iVar18 < (int)uVar23) {
                                stbi__grow_buffer_unsafe(z);
                                uVar35 = (ulong)(uint)z->code_bits;
                              }
                              iVar36 = 0;
                              uVar12 = (int)uVar35 - uVar23;
                              if ((int)uVar23 <= (int)uVar35) {
                                uVar26 = z->code_buffer;
                                uVar32 = uVar26 << (sbyte)uVar23 | uVar26 >> 0x20 - (sbyte)uVar23;
                                uVar40 = *(uint *)((long)stbi__bmask + (ulong)(uVar23 * 4));
                                z->code_buffer = ~uVar40 & uVar32;
                                z->code_bits = uVar12;
                                iVar36 = 0;
                                if (-1 < (int)uVar26) {
                                  iVar36 = *(int *)((long)stbi__jbias + (ulong)(uVar23 * 4));
                                }
                                iVar36 = (uVar32 & uVar40) + iVar36;
                                uVar35 = (ulong)uVar12;
                              }
                              uVar12 = (int)lVar39 + 1;
                              psVar31[bVar2] = (short)(iVar36 << (bVar6 & 0x1f));
                              paVar33 = local_128;
                            }
                          }
                          else {
                            uVar26 = uVar23 & 0xf;
                            uVar40 = z->code_bits - uVar26;
                            uVar35 = (ulong)uVar40;
                            if (z->code_bits < (int)uVar26) goto LAB_00124749;
                            lVar39 = (long)iVar36 + (ulong)(uVar23 >> 4 & 0xf);
                            z->code_buffer = uVar12 << (sbyte)uVar26;
                            z->code_bits = uVar40;
                            uVar12 = (int)lVar39 + 1;
                            psVar31[""[lVar39]] = (short)((uVar23 >> 8) << (bVar6 & 0x1f));
                          }
                          uVar37 = (ulong)uVar12;
                        } while ((int)uVar12 <= z->spec_end);
                      }
                      else {
LAB_00122edd:
                        z->eob_run = iVar36 + -1;
                      }
                    }
                    else if (iVar36 == 0) {
                      iVar36 = 0x10000 << (bVar6 & 0x1f);
                      uVar12 = iVar36 >> 0x10;
                      local_130 = -uVar12;
                      uVar35 = (ulong)(uint)z->code_bits;
                      do {
                        if ((int)uVar35 < 0x10) {
                          stbi__grow_buffer_unsafe(z);
                        }
                        uVar26 = z->code_buffer;
                        uVar14 = (ulong)z->huff_ac[iVar11].fast[uVar26 >> 0x17];
                        if (uVar14 == 0xff) {
                          lVar39 = 0;
                          do {
                            lVar21 = lVar39;
                            lVar39 = lVar21 + 1;
                          } while (z->huff_ac[iVar11].maxcode[lVar21 + 10] <= uVar26 >> 0x10);
                          uVar23 = z->code_bits;
                          uVar35 = (ulong)uVar23;
                          if (lVar39 == 8) goto LAB_0012473e;
                          if (((int)uVar23 < (int)(lVar21 + 10)) ||
                             (uVar40 = (uVar26 >> (0x17U - (char)lVar39 & 0x1f) &
                                       stbi__bmask[lVar21 + 10]) +
                                       z->huff_ac[iVar11].delta[lVar21 + 10], 0xff < uVar40))
                          goto LAB_00124749;
                          sVar9 = uVar26 << ((byte)(lVar21 + 10) & 0x1f);
                          uVar23 = (uVar23 - (int)lVar39) - 9;
                          uVar35 = (ulong)uVar23;
                          z->code_bits = uVar23;
                          z->code_buffer = sVar9;
                          uVar14 = (ulong)uVar40;
                        }
                        else {
                          bVar6 = z->huff_ac[iVar11].size[uVar14];
                          uVar23 = z->code_bits - (uint)bVar6;
                          uVar35 = (ulong)uVar23;
                          if (z->code_bits < (int)(uint)bVar6) goto LAB_00124749;
                          sVar9 = uVar26 << (bVar6 & 0x1f);
                          z->code_buffer = sVar9;
                          z->code_bits = uVar23;
                        }
                        bVar6 = z->huff_ac[iVar11].values[uVar14];
                        bVar2 = bVar6 >> 4;
                        uVar26 = (uint)bVar2;
                        uVar23 = (uint)uVar35;
                        if ((bVar6 & 0xf) == 1) {
                          uVar40 = uVar26;
                          if ((int)uVar23 < 1) {
                            stbi__grow_buffer_unsafe(z);
                            uVar23 = z->code_bits;
                            uVar35 = (ulong)uVar23;
                            uVar32 = local_130;
                            if ((int)uVar23 < 1) goto LAB_001231a8;
                            sVar9 = z->code_buffer;
                          }
                          z->code_buffer = sVar9 * 2;
                          uVar35 = (ulong)(uVar23 - 1);
                          z->code_bits = uVar23 - 1;
                          uVar32 = local_130;
                          if ((int)sVar9 < 0) {
                            uVar32 = uVar12;
                          }
                        }
                        else {
                          if ((bVar6 & 0xf) != 0) goto LAB_00124749;
                          uVar40 = 0xf;
                          uVar32 = 0;
                          if (bVar6 < 0xf0) {
                            z->eob_run = ~(-1 << bVar2);
                            uVar40 = 0x40;
                            if (0xf < bVar6) {
                              if ((int)uVar23 < (int)uVar26) {
                                stbi__grow_buffer_unsafe(z);
                                uVar35 = (ulong)(uint)z->code_bits;
                              }
                              uVar32 = 0;
                              uVar23 = (int)uVar35 - uVar26;
                              if ((int)uVar26 <= (int)uVar35) {
                                uVar32 = z->code_buffer << bVar2 | z->code_buffer >> 0x20 - bVar2;
                                uVar26 = stbi__bmask[uVar26];
                                z->code_buffer = ~uVar26 & uVar32;
                                uVar32 = uVar32 & uVar26;
                                z->code_bits = uVar23;
                                uVar35 = (ulong)uVar23;
                              }
                              z->eob_run = z->eob_run + uVar32;
                              uVar32 = 0;
                            }
                          }
                        }
LAB_001231a8:
                        uVar23 = z->spec_end;
                        uVar14 = (ulong)uVar23;
                        if ((int)uVar37 <= (int)uVar23) {
                          uVar38 = (long)(int)uVar37;
                          do {
                            uVar23 = (uint)uVar14;
                            uVar26 = (uint)uVar35;
                            bVar6 = ""[uVar38];
                            if (psVar31[bVar6] == 0) {
                              if (uVar40 == 0) {
                                uVar37 = (ulong)((int)uVar38 + 1);
                                psVar31[bVar6] = (short)uVar32;
                                paVar33 = local_128;
                                break;
                              }
                              uVar40 = uVar40 - 1;
                            }
                            else {
                              if ((int)uVar26 < 1) {
                                stbi__grow_buffer_unsafe(z);
                                uVar26 = z->code_bits;
                                uVar35 = (ulong)uVar26;
                                if ((int)uVar26 < 1) goto LAB_00123232;
                              }
                              sVar9 = z->code_buffer;
                              z->code_buffer = sVar9 * 2;
                              uVar35 = (ulong)(uVar26 - 1);
                              z->code_bits = uVar26 - 1;
                              if (((int)sVar9 < 0) &&
                                 (sVar3 = psVar31[bVar6], (uVar12 & (int)sVar3) == 0)) {
                                sVar5 = (short)((uint)iVar36 >> 0x10);
                                if (sVar3 < 1) {
                                  sVar5 = -sVar5;
                                }
                                psVar31[bVar6] = sVar3 + sVar5;
                              }
                            }
LAB_00123232:
                            uVar37 = uVar38 + 1;
                            uVar23 = z->spec_end;
                            uVar14 = (ulong)(int)uVar23;
                            bVar42 = (long)uVar38 < (long)uVar14;
                            uVar38 = uVar37;
                            paVar33 = local_128;
                          } while (bVar42);
                        }
                      } while ((int)uVar37 <= (int)uVar23);
                    }
                    else {
                      z->eob_run = iVar36 + -1;
                      if (z->spec_start <= z->spec_end) {
                        uVar12 = (0x10000 << (bVar6 & 0x1f)) >> 0x10;
                        do {
                          bVar6 = ""[uVar37];
                          if (psVar31[bVar6] != 0) {
                            iVar11 = z->code_bits;
                            if (iVar11 < 1) {
                              stbi__grow_buffer_unsafe(z);
                              iVar11 = z->code_bits;
                              if (iVar11 < 1) goto LAB_00122e92;
                            }
                            sVar9 = z->code_buffer;
                            z->code_buffer = sVar9 * 2;
                            z->code_bits = iVar11 + -1;
                            if (((int)sVar9 < 0) &&
                               (sVar3 = psVar31[bVar6], (uVar12 & (int)sVar3) == 0)) {
                              uVar23 = -uVar12;
                              if (0 < sVar3) {
                                uVar23 = uVar12;
                              }
                              psVar31[bVar6] = (short)uVar23 + sVar3;
                            }
                          }
LAB_00122e92:
                          bVar42 = (long)uVar37 < (long)z->spec_end;
                          uVar37 = uVar37 + 1;
                        } while (bVar42);
                      }
                    }
                  }
                  iVar11 = z->todo;
                  z->todo = iVar11 + -1;
                  if (iVar11 < 2) {
                    if (z->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(z);
                    }
                    bVar6 = z->marker;
                    if ((bVar6 & 0xf8) != 0xd0) goto LAB_00123b8f;
                    z->code_buffer = 0;
                    z->code_bits = 0;
                    z->nomore = 0;
                    z->img_comp[3].dc_pred = 0;
                    z->img_comp[2].dc_pred = 0;
                    z->img_comp[1].dc_pred = 0;
                    z->img_comp[0].dc_pred = 0;
                    z->marker = 0xff;
                    iVar11 = z->restart_interval;
                    if (iVar11 == 0) {
                      iVar11 = 0x7fffffff;
                    }
                    z->todo = iVar11;
                    z->eob_run = 0;
                  }
                  iVar8 = iVar8 + 1;
                } while (iVar8 != local_12c);
              }
              local_174 = local_174 + 1;
            } while (local_174 != local_11c);
          }
        }
        else {
          iVar8 = z->img_mcu_y;
          if (0 < iVar8) {
            iVar36 = z->img_mcu_x;
            iVar18 = 0;
            do {
              if (0 < iVar36) {
                iVar8 = 0;
                do {
                  iVar36 = z->scan_n;
                  if (0 < iVar36) {
                    lVar39 = 0;
                    do {
                      iVar11 = z->order[lVar39];
                      iVar27 = z->img_comp[iVar11].v;
                      if (0 < iVar27) {
                        iVar36 = paVar1[iVar11].h;
                        iVar28 = 0;
                        do {
                          if (0 < iVar36) {
                            iVar27 = 0;
                            do {
                              iVar36 = stbi__jpeg_decode_block_prog_dc
                                                 (z,paVar1[iVar11].coeff +
                                                    (iVar36 * iVar8 + iVar27 +
                                                    (paVar1[iVar11].v * iVar18 + iVar28) *
                                                    paVar1[iVar11].coeff_w) * 0x40,
                                                  z->huff_dc + paVar1[iVar11].hd,iVar11);
                              uVar35 = extraout_RDX_09;
                              if (iVar36 == 0) goto LAB_001246c9;
                              iVar27 = iVar27 + 1;
                              iVar36 = paVar1[iVar11].h;
                            } while (iVar27 < iVar36);
                            iVar27 = paVar1[iVar11].v;
                          }
                          iVar28 = iVar28 + 1;
                        } while (iVar28 < iVar27);
                        iVar36 = z->scan_n;
                      }
                      lVar39 = lVar39 + 1;
                    } while (lVar39 < iVar36);
                    iVar11 = z->todo;
                  }
                  z->todo = iVar11 + -1;
                  bVar42 = iVar11 < 2;
                  iVar11 = iVar11 + -1;
                  if (bVar42) {
                    if (z->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(z);
                    }
                    bVar6 = z->marker;
                    if ((bVar6 & 0xf8) != 0xd0) goto LAB_00123b8f;
                    z->code_buffer = 0;
                    z->code_bits = 0;
                    z->nomore = 0;
                    z->img_comp[3].dc_pred = 0;
                    z->img_comp[2].dc_pred = 0;
                    z->img_comp[1].dc_pred = 0;
                    z->img_comp[0].dc_pred = 0;
                    z->marker = 0xff;
                    iVar11 = z->restart_interval;
                    if (iVar11 == 0) {
                      iVar11 = 0x7fffffff;
                    }
                    z->todo = iVar11;
                    z->eob_run = 0;
                  }
                  iVar8 = iVar8 + 1;
                  iVar36 = z->img_mcu_x;
                } while (iVar8 < iVar36);
                iVar8 = z->img_mcu_y;
              }
              iVar18 = iVar18 + 1;
            } while (iVar18 < iVar8);
          }
        }
        goto LAB_00123b87;
      }
      uVar12 = (uint)bVar6;
      if (uVar12 == 0xdc) {
        iVar8 = stbi__get16be(z->s);
        sVar9 = stbi__get16be(z->s);
        uVar35 = extraout_RDX_01;
        if (iVar8 == 4) {
          if (sVar9 == z->s->img_y) goto LAB_001229b9;
          pcVar19 = "bad DNL height";
        }
        else {
          pcVar19 = "bad DNL len";
        }
        goto LAB_001246b6;
      }
      if (uVar12 == 0xd9) {
        psVar13 = z->s;
        if ((z->progressive != 0) && (0 < psVar13->img_n)) {
          lVar39 = 0;
          do {
            iVar8 = z->img_comp[lVar39].y + 7 >> 3;
            if (0 < iVar8) {
              uVar12 = paVar1[lVar39].x + 7 >> 3;
              iVar11 = 0;
              do {
                if (0 < (int)uVar12) {
                  uVar35 = 0;
                  do {
                    psVar31 = paVar1[lVar39].coeff +
                              (paVar1[lVar39].coeff_w * iVar11 + (int)uVar35) * 0x40;
                    iVar36 = paVar1[lVar39].tq;
                    lVar21 = 0;
                    do {
                      psVar31[lVar21] = psVar31[lVar21] * z->dequant[iVar36][lVar21];
                      lVar21 = lVar21 + 1;
                    } while (lVar21 != 0x40);
                    (*z->idct_block_kernel)
                              (paVar1[lVar39].data +
                               uVar35 * 8 + (long)(iVar11 * 8 * paVar1[lVar39].w2),paVar1[lVar39].w2
                               ,psVar31);
                    uVar35 = uVar35 + 1;
                    uVar24 = extraout_RDX_13;
                  } while (uVar35 != uVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 != iVar8);
              psVar13 = z->s;
            }
            iVar8 = (int)uVar24;
            lVar39 = lVar39 + 1;
          } while (lVar39 < psVar13->img_n);
        }
      }
      else {
        iVar8 = stbi__process_marker(z,uVar12);
        if (iVar8 != 0) goto LAB_001229b9;
        psVar13 = z->s;
        iVar8 = extraout_EDX;
      }
      uVar12 = psVar13->img_n;
      uVar23 = (2 < (int)uVar12) + 1 + (uint)(2 < (int)uVar12);
      if ((uint)local_138 != 0) {
        uVar23 = (uint)local_138;
      }
      if (uVar12 == 3) {
        bVar42 = true;
        if (z->rgb != 3) {
          if (z->app14_color_transform != 0) goto LAB_00123e27;
          bVar42 = z->jfif == 0;
        }
      }
      else {
LAB_00123e27:
        bVar42 = false;
      }
      uVar26 = 1;
      if (bVar42) {
        uVar26 = uVar12;
      }
      if (2 < (int)uVar23) {
        uVar26 = uVar12;
      }
      if (uVar12 != 3) {
        uVar26 = uVar12;
      }
      if (0 < (int)uVar26) {
        local_158[2] = (stbi_uc *)0x0;
        lStack_140 = 0;
        local_158[0] = (stbi_uc *)0x0;
        local_158[1] = (stbi_uc *)0x0;
        uVar40 = psVar13->img_x;
        local_138 = (ulong)uVar40;
        lVar39 = 0;
        do {
          pvVar15 = malloc((ulong)(uVar40 + 3));
          *(void **)((long)&z->img_comp[0].linebuf + lVar39 * 2) = pvVar15;
          if (pvVar15 == (void *)0x0) {
            stbi__free_jpeg_components(z,uVar12,why);
            *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
            pvVar15 = (void *)0x0;
            goto LAB_001246db;
          }
          uVar35 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar39 * 2);
          iVar8 = (int)uVar35;
          *(int *)((long)local_e0 + lVar39) = iVar8;
          iVar11 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar39 * 2);
          *(int *)((long)local_e0 + lVar39 + 4) = iVar11;
          *(int *)((long)local_e0 + lVar39 + 0xc) = iVar11 >> 1;
          *(int *)((long)local_e0 + lVar39 + 8) =
               (int)((ulong)((uVar40 - 1) + iVar8) / (uVar35 & 0xffffffff));
          *(undefined4 *)((long)local_e0 + lVar39 + 0x10) = 0;
          uVar24 = *(undefined8 *)((long)&z->img_comp[0].data + lVar39 * 2);
          *(undefined8 *)((long)local_f0 + lVar39 + 8) = uVar24;
          *(undefined8 *)((long)local_f0 + lVar39) = uVar24;
          if (iVar8 == 2) {
            pcVar16 = stbi__resample_row_h_2;
            if (iVar11 != 1) {
              if (iVar11 != 2) goto LAB_00123f61;
              pcVar16 = z->resample_row_hv_2_kernel;
            }
          }
          else if (iVar8 == 1) {
            pcVar16 = stbi__resample_row_generic;
            if (iVar11 == 2) {
              pcVar16 = stbi__resample_row_v_2;
            }
            if (iVar11 == 1) {
              pcVar16 = resample_row_1;
            }
          }
          else {
LAB_00123f61:
            pcVar16 = stbi__resample_row_generic;
          }
          *(code **)((long)local_f8 + lVar39) = pcVar16;
          lVar39 = lVar39 + 0x30;
        } while ((ulong)uVar26 * 0x30 != lVar39);
        sVar9 = psVar13->img_y;
        pvVar15 = stbi__malloc_mad3(uVar23,(int)local_138,sVar9,1);
        if (pvVar15 != (void *)0x0) {
          iVar8 = why_00;
          if (sVar9 != 0) {
            iVar11 = 0;
            uVar12 = 0;
            do {
              sVar9 = psVar13->img_x;
              local_138 = CONCAT44(local_138._4_4_,uVar12);
              ppsVar41 = local_158;
              lVar39 = 0;
              do {
                puVar17 = (undefined8 *)((long)local_f0 + lVar39 + 8);
                iVar8 = *(int *)((long)local_e0 + lVar39 + 0xc);
                iVar36 = *(int *)((long)local_e0 + lVar39 + 4);
                iVar18 = iVar36 >> 1;
                puVar22 = puVar17;
                if (iVar8 < iVar18) {
                  puVar22 = (undefined8 *)((long)local_f0 + lVar39);
                }
                if (iVar18 <= iVar8) {
                  puVar17 = (undefined8 *)((long)local_f0 + lVar39);
                }
                auVar43 = (**(code **)((long)local_f8 + lVar39))
                                    (*(undefined8 *)((long)&z->img_comp[0].linebuf + lVar39 * 2),
                                     *puVar22,*puVar17,*(undefined4 *)((long)local_e0 + lVar39 + 8),
                                     *(undefined4 *)((long)local_e0 + lVar39));
                psVar25 = auVar43._8_8_;
                *ppsVar41 = auVar43._0_8_;
                *(int *)((long)local_e0 + lVar39 + 0xc) = iVar8 + 1;
                if (iVar36 <= iVar8 + 1) {
                  *(undefined4 *)((long)local_e0 + lVar39 + 0xc) = 0;
                  lVar21 = *(long *)((long)local_f0 + lVar39 + 8);
                  *(long *)((long)local_f0 + lVar39) = lVar21;
                  iVar8 = *(int *)((long)local_e0 + lVar39 + 0x10) + 1;
                  *(int *)((long)local_e0 + lVar39 + 0x10) = iVar8;
                  if (iVar8 < *(int *)((long)&z->img_comp[0].y + lVar39 * 2)) {
                    *(long *)((long)local_f0 + lVar39 + 8) =
                         lVar21 + *(int *)((long)&z->img_comp[0].w2 + lVar39 * 2);
                  }
                }
                lVar39 = lVar39 + 0x30;
                ppsVar41 = ppsVar41 + 1;
              } while ((ulong)uVar26 * 0x30 != lVar39);
              if ((int)uVar23 < 3) {
                psVar13 = z->s;
                if (bVar42) {
                  if (uVar23 == 1) {
                    if (psVar13->img_x != 0) {
                      uVar35 = 0;
                      do {
                        bVar6 = local_158[2][uVar35];
                        *(char *)((long)pvVar15 + uVar35 + sVar9 * iVar11) =
                             (char)((uint)bVar6 * 2 + ((uint)bVar6 + (uint)bVar6 * 8) * 3 +
                                    (uint)local_158[1][uVar35] * 0x96 +
                                    (uint)local_158[0][uVar35] * 0x4d >> 8);
                        uVar35 = uVar35 + 1;
                        psVar25 = local_158[2];
                      } while (uVar35 < psVar13->img_x);
                    }
                  }
                  else if (psVar13->img_x != 0) {
                    uVar35 = 0;
                    do {
                      bVar6 = local_158[2][uVar35];
                      *(char *)((long)pvVar15 + uVar35 * 2 + (ulong)(sVar9 * iVar11)) =
                           (char)((uint)bVar6 * 2 + ((uint)bVar6 + (uint)bVar6 * 8) * 3 +
                                  (uint)local_158[1][uVar35] * 0x96 +
                                  (uint)local_158[0][uVar35] * 0x4d >> 8);
                      *(undefined1 *)((long)pvVar15 + uVar35 * 2 + (ulong)(sVar9 * iVar11) + 1) =
                           0xff;
                      uVar35 = uVar35 + 1;
                      psVar25 = local_158[2];
                    } while (uVar35 < psVar13->img_x);
                  }
                }
                else if (psVar13->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    if (psVar13->img_x != 0) {
                      puVar29 = (undefined1 *)((long)pvVar15 + (ulong)(sVar9 * iVar11) + 1);
                      psVar25 = (stbi_uc *)0x0;
                      do {
                        iVar8 = (local_158[0][(long)psVar25] ^ 0xff) * (uint)psVar25[lStack_140];
                        puVar29[-1] = (char)((iVar8 + 0x80U >> 8) + iVar8 + 0x80 >> 8);
                        *puVar29 = 0xff;
                        psVar25 = psVar25 + 1;
                        puVar29 = puVar29 + uVar23;
                      } while (psVar25 < (stbi_uc *)(ulong)psVar13->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_001243b9;
                    if (psVar13->img_x != 0) {
                      puVar29 = (undefined1 *)((long)pvVar15 + (ulong)(sVar9 * iVar11) + 1);
                      uVar35 = 0;
                      do {
                        bVar6 = *(byte *)(lStack_140 + uVar35);
                        iVar8 = (uint)local_158[0][uVar35] * (uint)bVar6;
                        iVar36 = (uint)local_158[1][uVar35] * (uint)bVar6;
                        puVar29[-1] = (char)((((uint)local_158[2][uVar35] * (uint)bVar6 + 0x80 >> 8)
                                              + (uint)local_158[2][uVar35] * (uint)bVar6 + 0x80 >> 8
                                             ) * 0x1d +
                                             (iVar36 + (iVar36 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                             (iVar8 + (iVar8 + 0x80U >> 8) + 0x80 >> 8) * 0x4d >> 8)
                        ;
                        *puVar29 = 0xff;
                        uVar35 = uVar35 + 1;
                        puVar29 = puVar29 + uVar23;
                        psVar25 = local_158[1];
                      } while (uVar35 < psVar13->img_x);
                    }
                  }
                }
                else {
LAB_001243b9:
                  if (uVar23 == 1) {
                    if (psVar13->img_x != 0) {
                      psVar34 = (stbi_uc *)0x0;
                      do {
                        psVar34[(ulong)(sVar9 * iVar11) + (long)pvVar15] =
                             local_158[0][(long)psVar34];
                        psVar34 = psVar34 + 1;
                        psVar25 = (stbi_uc *)(ulong)psVar13->img_x;
                      } while (psVar34 < (stbi_uc *)(ulong)psVar13->img_x);
                    }
                  }
                  else if (psVar13->img_x != 0) {
                    psVar34 = (stbi_uc *)0x0;
                    do {
                      *(stbi_uc *)((long)pvVar15 + (long)psVar34 * 2 + (ulong)(sVar9 * iVar11)) =
                           local_158[0][(long)psVar34];
                      *(undefined1 *)
                       ((long)pvVar15 + (long)psVar34 * 2 + (ulong)(sVar9 * iVar11) + 1) = 0xff;
                      psVar34 = psVar34 + 1;
                      psVar25 = (stbi_uc *)(ulong)psVar13->img_x;
                    } while (psVar34 < (stbi_uc *)(ulong)psVar13->img_x);
                  }
                }
              }
              else {
                psVar34 = (stbi_uc *)((ulong)(uVar12 * uVar23 * sVar9) + (long)pvVar15);
                psVar13 = z->s;
                if (psVar13->img_n == 3) {
                  if (bVar42) {
                    if (psVar13->img_x != 0) {
                      puVar29 = (undefined1 *)((long)pvVar15 + (ulong)(sVar9 * iVar11) + 3);
                      psVar25 = (stbi_uc *)0x0;
                      do {
                        puVar29[-3] = local_158[0][(long)psVar25];
                        puVar29[-2] = local_158[1][(long)psVar25];
                        puVar29[-1] = local_158[2][(long)psVar25];
                        *puVar29 = 0xff;
                        psVar25 = psVar25 + 1;
                        puVar29 = puVar29 + uVar23;
                      } while (psVar25 < (stbi_uc *)(ulong)psVar13->img_x);
                    }
                  }
                  else {
LAB_0012442d:
                    (*z->YCbCr_to_RGB_kernel)
                              (psVar34,local_158[0],local_158[1],local_158[2],psVar13->img_x,uVar23)
                    ;
                    psVar13 = z->s;
                    psVar25 = extraout_RDX_14;
                  }
                }
                else if (psVar13->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    (*z->YCbCr_to_RGB_kernel)
                              (psVar34,local_158[0],local_158[1],local_158[2],psVar13->img_x,uVar23)
                    ;
                    psVar13 = z->s;
                    psVar25 = extraout_RDX_15;
                    if (psVar13->img_x != 0) {
                      pbVar30 = (byte *)((long)pvVar15 + (ulong)(sVar9 * iVar11) + 2);
                      psVar34 = (stbi_uc *)0x0;
                      do {
                        bVar6 = psVar34[lStack_140];
                        iVar8 = (pbVar30[-2] ^ 0xff) * (uint)bVar6;
                        pbVar30[-2] = (byte)((iVar8 + 0x80U >> 8) + iVar8 + 0x80 >> 8);
                        iVar8 = (pbVar30[-1] ^ 0xff) * (uint)bVar6;
                        pbVar30[-1] = (byte)((iVar8 + 0x80U >> 8) + iVar8 + 0x80 >> 8);
                        iVar8 = (*pbVar30 ^ 0xff) * (uint)bVar6;
                        *pbVar30 = (byte)((iVar8 + 0x80U >> 8) + iVar8 + 0x80 >> 8);
                        psVar34 = psVar34 + 1;
                        pbVar30 = pbVar30 + uVar23;
                        psVar25 = (stbi_uc *)(ulong)psVar13->img_x;
                      } while (psVar34 < (stbi_uc *)(ulong)psVar13->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_0012442d;
                    if (psVar13->img_x != 0) {
                      puVar29 = (undefined1 *)((long)pvVar15 + (ulong)(sVar9 * iVar11) + 3);
                      uVar35 = 0;
                      do {
                        bVar6 = *(byte *)(lStack_140 + uVar35);
                        iVar8 = (uint)local_158[0][uVar35] * (uint)bVar6;
                        puVar29[-3] = (char)((iVar8 + 0x80U >> 8) + iVar8 + 0x80 >> 8);
                        iVar8 = (uint)local_158[1][uVar35] * (uint)bVar6;
                        puVar29[-2] = (char)((iVar8 + 0x80U >> 8) + iVar8 + 0x80 >> 8);
                        puVar29[-1] = (char)(((uint)local_158[2][uVar35] * (uint)bVar6 + 0x80 >> 8)
                                             + (uint)local_158[2][uVar35] * (uint)bVar6 + 0x80 >> 8)
                        ;
                        *puVar29 = 0xff;
                        uVar35 = uVar35 + 1;
                        puVar29 = puVar29 + uVar23;
                        psVar25 = local_158[2];
                      } while (uVar35 < psVar13->img_x);
                    }
                  }
                }
                else if (psVar13->img_x != 0) {
                  puVar29 = (undefined1 *)((long)pvVar15 + (ulong)(sVar9 * iVar11) + 3);
                  uVar35 = 0;
                  do {
                    sVar7 = local_158[0][uVar35];
                    puVar29[-1] = sVar7;
                    puVar29[-2] = sVar7;
                    puVar29[-3] = sVar7;
                    *puVar29 = 0xff;
                    uVar35 = uVar35 + 1;
                    puVar29 = puVar29 + uVar23;
                  } while (uVar35 < psVar13->img_x);
                }
              }
              iVar8 = (int)psVar25;
              uVar12 = (uint)local_138 + 1;
              iVar11 = iVar11 + uVar23;
            } while (uVar12 < psVar13->img_y);
            uVar12 = psVar13->img_n;
          }
          stbi__free_jpeg_components(z,uVar12,iVar8);
          psVar13 = z->s;
          *local_110 = psVar13->img_x;
          *local_108 = psVar13->img_y;
          if (local_100 != (int *)0x0) {
            *local_100 = (uint)(2 < psVar13->img_n) * 2 + 1;
          }
          goto LAB_001246db;
        }
        stbi__free_jpeg_components(z,uVar12,why_00);
        lVar39 = *in_FS_OFFSET;
        pcVar19 = "outofmem";
        goto LAB_00122873;
      }
    }
    stbi__free_jpeg_components(z,uVar12,iVar8);
  }
  else {
    lVar39 = *in_FS_OFFSET;
    pcVar19 = "bad req_comp";
LAB_00122873:
    *(char **)(lVar39 + -0x20) = pcVar19;
  }
  pvVar15 = (void *)0x0;
LAB_001246db:
  free(z);
  return pvVar15;
LAB_00123b7d:
  bVar42 = false;
  uVar35 = uVar37;
LAB_00123b7f:
  if (!bVar42) goto LAB_001246c9;
LAB_00123b87:
  bVar6 = z->marker;
LAB_00123b8f:
  if (bVar6 == 0xff) {
    while (psVar13 = z->s, (psVar13->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00123c95:
      if (psVar13->img_buffer_end <= psVar13->img_buffer) goto LAB_00123ca9;
LAB_00123bad:
      psVar13 = z->s;
      psVar25 = psVar13->img_buffer;
      if (psVar25 < psVar13->img_buffer_end) {
LAB_00123bdb:
        psVar13->img_buffer = psVar25 + 1;
        sVar7 = *psVar25;
      }
      else {
        if (psVar13->read_from_callbacks != 0) {
          stbi__refill_buffer(psVar13);
          psVar25 = psVar13->img_buffer;
          goto LAB_00123bdb;
        }
        sVar7 = '\0';
      }
      while (sVar7 == 0xff) {
        psVar13 = z->s;
        if ((psVar13->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00123c10:
          if (psVar13->img_buffer_end <= psVar13->img_buffer) goto LAB_00123ca9;
        }
        else {
          iVar8 = (*(psVar13->io).eof)(psVar13->io_user_data);
          if (iVar8 != 0) {
            if (psVar13->read_from_callbacks != 0) goto LAB_00123c10;
            goto LAB_00123ca9;
          }
        }
        psVar13 = z->s;
        psVar25 = psVar13->img_buffer;
        if (psVar25 < psVar13->img_buffer_end) {
LAB_00123c4e:
          psVar13->img_buffer = psVar25 + 1;
          sVar7 = *psVar25;
        }
        else {
          if (psVar13->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar13);
            psVar25 = psVar13->img_buffer;
            goto LAB_00123c4e;
          }
          sVar7 = '\0';
        }
        if ((byte)(sVar7 - 1) < 0xfe) goto LAB_00123cb0;
      }
    }
    iVar8 = (*(psVar13->io).eof)(psVar13->io_user_data);
    if (iVar8 == 0) goto LAB_00123bad;
    if (psVar13->read_from_callbacks != 0) goto LAB_00123c95;
LAB_00123ca9:
    sVar7 = 0xff;
LAB_00123cb0:
    z->marker = sVar7;
  }
  bVar6 = stbi__get_marker(z);
  uVar24 = extraout_RDX_12;
  if ((bVar6 & 0xf8) == 0xd0) {
LAB_001229b9:
    bVar6 = stbi__get_marker(z);
    uVar24 = extraout_RDX_02;
  }
  goto LAB_00122961;
LAB_0012473e:
  uVar35 = (ulong)(uVar23 - 0x10);
  z->code_bits = uVar23 - 0x10;
LAB_00124749:
  pcVar19 = "bad huffman code";
LAB_001246b6:
  *(char **)(*in_FS_OFFSET + -0x20) = pcVar19;
  goto LAB_001246c9;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}